

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

Address __thiscall Socket::getLocalAddress(Socket *this)

{
  int iVar1;
  SocketError *this_00;
  allocator local_4d;
  socklen_t localAddressLength;
  Address address;
  string local_38;
  
  localAddressLength = 0x10;
  iVar1 = getsockname(this->socketDescriptor,(sockaddr *)&address,&localAddressLength);
  if (iVar1 != -1) {
    return address;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,"Socket error: could not get address of assigned socket!",&local_4d
            );
  SocketError::SocketError(this_00,&local_38,0);
  __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
}

Assistant:

Address Socket::getLocalAddress(){
    Address address;
    socklen_t localAddressLength = sizeof(address);
    if (getsockname(socketDescriptor,(struct sockaddr *) &address, &localAddressLength) == -1) {
        throw SocketError("Socket error: could not get address of assigned socket!");
    }
    else{
        return address;
    }
}